

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

BranchInstr * __thiscall IR::BranchInstr::CloneBranchInstr(BranchInstr *this)

{
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LabelInstr *this_01;
  Cloner *pCVar4;
  BranchInstr *pBVar5;
  LabelInstr *local_20;
  LabelInstr *instrLabel;
  Func *func;
  BranchInstr *this_local;
  
  bVar2 = IsMultiBranch(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x70c,"(!this->IsMultiBranch())",
                       "Cloning Not supported for MultiBranchInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = (this->super_Instr).m_func;
  this_01 = GetTarget(this);
  local_20 = LabelInstr::CloneLabel(this_01,0);
  if (local_20 == (LabelInstr *)0x0) {
    local_20 = GetTarget(this);
    pCVar4 = Func::GetCloner(this_00);
    pCVar4->fRetargetClonedBranch = 1;
  }
  pBVar5 = New((this->super_Instr).m_opcode,local_20,this_00);
  return pBVar5;
}

Assistant:

BranchInstr *
BranchInstr::CloneBranchInstr() const
{
    AssertMsg(!this->IsMultiBranch(),"Cloning Not supported for MultiBranchInstr");
    Func * func = this->m_func;
    // See if the target has already been cloned.
    IR::LabelInstr * instrLabel = this->GetTarget()->CloneLabel(false);
    if (instrLabel == nullptr)
    {
        // We didn't find a clone for this label.
        // We'll go back and retarget the cloned branch if the target turns up in the cloned range.
        instrLabel = this->GetTarget();
        func->GetCloner()->fRetargetClonedBranch = TRUE;
    }
    return IR::BranchInstr::New(this->m_opcode, instrLabel, func);
}